

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadEncapsulation(ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  IssuePtr *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  size_t sVar5;
  IssuePtr issue;
  XmlNodePtr componentRefNode;
  ComponentPtr parentComponent;
  IssuePtr issue_2;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string textNode;
  NameList usedNames;
  string encapsulationId;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  usedNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usedNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usedNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XmlNode::firstChild((XmlNode *)&componentRefNode);
  do {
    if (componentRefNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&componentRefNode.
                  super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&usedNames);
      return;
    }
    parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    encapsulationId._M_dataplus._M_p = (pointer)&encapsulationId.field_2;
    encapsulationId._M_string_length = 0;
    encapsulationId.field_2._M_local_buf[0] = '\0';
    bVar4 = parseNode(this,&componentRefNode,"component_ref");
    if (bVar4) {
      loadComponentRef((ParserImpl *)&textNode,(ModelPtr *)this,(XmlNodePtr *)model,
                       (NameList *)&componentRefNode);
      std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&parentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
      if (parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        Issue::IssueImpl::create();
        pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_108,
                   (NamedEntity *)
                   (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        std::operator+(&local_e8,"Encapsulation in model \'",&local_108);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &textNode,&local_e8,
                       "\' specifies an invalid parent component_ref that also does not have any children."
                      );
        Issue::IssueImpl::setDescription(pIVar1,&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,model);
        Issue::IssueImpl::setReferenceRule
                  ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,ENCAPSULATION_CHILD);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
        pIVar2 = &issue_2;
      }
      else {
LAB_001fce78:
        ComponentEntity::addComponent
                  (&((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_ComponentEntity,&parentComponent);
        sVar5 = ComponentEntity::componentCount
                          (&(parentComponent.
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_ComponentEntity);
        if (sVar5 != 0) goto LAB_001fcfb8;
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_50,
                   (NamedEntity *)
                   (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_2
                       ,"Encapsulation in model \'",&local_50);
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_2
                       ,"\' specifies \'");
        NamedEntity::name_abi_cxx11_
                  (&local_70,
                   (NamedEntity *)
                   parentComponent.
                   super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::operator+(&local_e8,&local_108,&local_70);
        std::operator+(&textNode,&local_e8,
                       "\' as a parent component_ref but it does not have any children.");
        Issue::IssueImpl::setDescription(pIVar1,&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&issue_2);
        std::__cxx11::string::~string((string *)&local_50);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,model);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,ENCAPSULATION_CHILD);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        pIVar2 = &issue;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pIVar2->super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
LAB_001fcfb8:
      XmlNode::next((XmlNode *)&textNode);
      std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&componentRefNode.
                  super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
    }
    else {
      bVar4 = XmlNode::isText(componentRefNode.
                              super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
      if (!bVar4) {
        bVar4 = XmlNode::isComment(componentRefNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (!bVar4) {
          if (this->mParsing1XVersion == true) {
            bVar4 = XmlNode::isCellml1XElement
                              (componentRefNode.
                               super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,"relationship_ref");
            if (bVar4) goto LAB_001fce6c;
          }
          Issue::IssueImpl::create();
          pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_50,
                     (NamedEntity *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_2,"Encapsulation in model \'",&local_50);
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_2,"\' has an invalid child element \'");
          XmlNode::name_abi_cxx11_
                    (&local_70,
                     componentRefNode.
                     super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          std::operator+(&local_e8,&local_108,&local_70);
          std::operator+(&textNode,&local_e8,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&issue_2);
          std::__cxx11::string::~string((string *)&local_50);
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,model);
          Issue::IssueImpl::setReferenceRule
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,ENCAPSULATION_CHILD);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
LAB_001fce6c:
        if (parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) goto LAB_001fce78;
        goto LAB_001fcfb8;
      }
      XmlNode::convertToString_abi_cxx11_
                (&textNode,
                 componentRefNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      bVar4 = hasNonWhitespaceCharacters(&textNode);
      if (bVar4) {
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        NamedEntity::name_abi_cxx11_
                  (&local_70,
                   (NamedEntity *)
                   (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        std::operator+(&local_50,"Encapsulation in model \'",&local_70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_2
                       ,&local_50,"\' has an invalid non-whitespace child text element \'");
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_2
                       ,&textNode);
        std::operator+(&local_e8,&local_108,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&issue_2);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,model);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
      }
      else {
        XmlNode::next((XmlNode *)&local_e8);
        std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&componentRefNode.
                    super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&local_e8);
        pbVar3 = &local_e8;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pbVar3->_M_string_length);
      std::__cxx11::string::~string((string *)&textNode);
      if (bVar4) goto LAB_001fce6c;
    }
    std::__cxx11::string::~string((string *)&encapsulationId);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadEncapsulation(const ModelPtr &model, const XmlNodePtr &node)
{
    NameList usedNames;
    XmlNodePtr componentRefNode = node->firstChild();
    while (componentRefNode != nullptr) {
        ComponentPtr parentComponent = nullptr;
        std::string encapsulationId;
        bool haveComponentRef = false;
        if (parseNode(componentRefNode, "component_ref")) {
            haveComponentRef = true;
            parentComponent = loadComponentRef(model, componentRefNode, usedNames);
        } else if (componentRefNode->isText()) {
            const std::string textNode = componentRefNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            } else {
                // Continue to next node if this is whitespace (don't try to parse children of whitespace).
                componentRefNode = componentRefNode->next();
                continue;
            }
        } else if (componentRefNode->isComment()) {
            // Do nothing.
        } else if (mParsing1XVersion && componentRefNode->isCellml1XElement("relationship_ref")) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + componentRefNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        // Add the parentComponent to the model with its child(ren) encapsulated.
        if (parentComponent) {
            model->addComponent(parentComponent);
            if (parentComponent->componentCount() == 0) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponent->name() + "' as a parent component_ref but it does not have any children.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                addIssue(issue);
            }
        } else if (haveComponentRef) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies an invalid parent component_ref that also does not have any children.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        componentRefNode = componentRefNode->next();
    }
}